

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netbase.h
# Opt level: O0

string * __thiscall Proxy::ToString_abi_cxx11_(Proxy *this)

{
  long lVar1;
  long in_RSI;
  string *in_RDI;
  long in_FS_OFFSET;
  CService *unaff_retaddr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000008;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000010;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((*(byte *)(in_RSI + 0x48) & 1) == 0) {
    CService::ToStringAddrPort_abi_cxx11_(unaff_retaddr);
  }
  else {
    std::__cxx11::string::string(in_stack_00000010,in_stack_00000008);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

std::string ToString() const
    {
        if (m_is_unix_socket) return m_unix_socket_path;
        return proxy.ToStringAddrPort();
    }